

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::ZeroQueuedPages(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachNonLeafPageAllocator<Memory::HeapInfo::ZeroQueuedPages()::__0>(this);
  return;
}

Assistant:

void
HeapInfo::ZeroQueuedPages()
{
    ForEachNonLeafPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->ZeroQueuedPages();
    });
}